

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_som.cxx
# Opt level: O0

xr_surface * __thiscall
som_surface_factory::create_surface(som_surface_factory *this,xr_raw_surface *raw_surface)

{
  bool bVar1;
  xr_surface *this_00;
  string *psVar2;
  xr_gamemtl *pxVar3;
  xr_gamemtl *gamemtl;
  xr_surface *surface;
  xr_raw_surface *raw_surface_local;
  som_surface_factory *this_local;
  
  this_00 = (xr_surface *)operator_new(0xd0);
  xray_re::xr_surface::xr_surface(this_00,false);
  psVar2 = xray_re::xr_surface::texture_abi_cxx11_(this_00);
  std::__cxx11::string::operator=((string *)psVar2,"prop\\prop_fake_kollision");
  pxVar3 = xray_re::xr_gamemtls_lib::get_material
                     (this->gamemtls_lib,(uint)(raw_surface->field_0).field_0.gamemtl);
  if (pxVar3 != (xr_gamemtl *)0x0) {
    psVar2 = xray_re::xr_surface::gamemtl_abi_cxx11_(this_00);
    std::__cxx11::string::operator=((string *)psVar2,(string *)&pxVar3->name);
  }
  bVar1 = xray_re::xr_raw_surface::two_sided(raw_surface);
  if (bVar1) {
    xray_re::xr_surface::set_two_sided(this_00);
  }
  return this_00;
}

Assistant:

xr_surface* som_surface_factory::create_surface(const xr_raw_surface& raw_surface) const
{
	xr_surface* surface = new xr_surface;
	surface->texture() = "prop\\prop_fake_kollision";
	const xr_gamemtl* gamemtl = gamemtls_lib->get_material(raw_surface.gamemtl);
	if (gamemtl)
		surface->gamemtl() = gamemtl->name;
	if (raw_surface.two_sided())
		surface->set_two_sided();
	return surface;
}